

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O0

uchar pseudo_median<unsigned_char>(uchar *begin,uchar *end)

{
  uchar uVar1;
  uchar b;
  uchar c;
  ulong uVar2;
  size_t N;
  uchar *end_local;
  uchar *begin_local;
  
  uVar2 = (long)end - (long)begin;
  if (3 < uVar2) {
    uVar1 = med3char<unsigned_char>(*begin,begin[1],begin[2]);
    b = med3char<unsigned_char>(begin[uVar2 >> 1],begin[(uVar2 >> 1) + 1],begin[(uVar2 >> 1) + 2]);
    c = med3char<unsigned_char>(begin[uVar2 - 3],begin[uVar2 - 2],begin[uVar2 - 1]);
    uVar1 = med3char<unsigned_char>(uVar1,b,c);
    return uVar1;
  }
  __assert_fail("N>3",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/median.h"
                ,0x41,"CharT pseudo_median(CharT *, CharT *) [CharT = unsigned char]");
}

Assistant:

inline CharT
pseudo_median(CharT* begin, CharT* end)
{
	size_t N=end-begin;
	assert(N>3);
	return med3char(
			med3char(begin[0],   begin[1],     begin[2]),
			med3char(begin[N/2], begin[N/2+1], begin[N/2+2]),
			med3char(begin[N-3], begin[N-2],   begin[N-1])
		       );
}